

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

int32 acmod_set_id2tri(acmod_set_t *acmod_set,acmod_id_t *phone,acmod_id_t *left_context,
                      acmod_id_t *right_context,word_posn_t *posn,acmod_id_t id)

{
  acmod_t *paVar1;
  uint uVar2;
  acmod_id_t aVar3;
  uint32 addr;
  acmod_t *multi;
  acmod_id_t id_local;
  word_posn_t *posn_local;
  acmod_id_t *right_context_local;
  acmod_id_t *left_context_local;
  acmod_id_t *phone_local;
  acmod_set_t *acmod_set_local;
  
  paVar1 = acmod_set->multi;
  if (id < acmod_set->n_ci) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
            ,0x2e8,"ID given to acmod_set_id2tri() is a CI acoustic model ID\n");
    acmod_set_local._4_4_ = -1;
  }
  else {
    uVar2 = id - acmod_set->n_ci;
    *phone = (uint)paVar1[uVar2].base;
    *left_context = (uint)paVar1[uVar2].left_context;
    *right_context = (uint)paVar1[uVar2].right_context;
    *posn = paVar1[uVar2].posn;
    aVar3 = acmod_set_tri2id(acmod_set,(uint)paVar1[uVar2].base,(uint)paVar1[uVar2].left_context,
                             (uint)paVar1[uVar2].right_context,paVar1[uVar2].posn);
    if (aVar3 != id) {
      __assert_fail("acmod_set_tri2id(acmod_set, multi[addr].base, multi[addr].left_context, multi[addr].right_context, multi[addr].posn) == id"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                    ,0x2f8,
                    "int32 acmod_set_id2tri(acmod_set_t *, acmod_id_t *, acmod_id_t *, acmod_id_t *, word_posn_t *, acmod_id_t)"
                   );
    }
    acmod_set_local._4_4_ = 0;
  }
  return acmod_set_local._4_4_;
}

Assistant:

int32
acmod_set_id2tri(acmod_set_t *acmod_set,
		 acmod_id_t *phone,
		 acmod_id_t *left_context,
		 acmod_id_t *right_context,
		 word_posn_t *posn,
		 acmod_id_t id)
{
    acmod_t *multi = acmod_set->multi;
    uint32 addr;

    if (id < acmod_set->n_ci) {
	E_ERROR("ID given to acmod_set_id2tri() is a CI acoustic model ID\n");

	return S3_ERROR;
    }

    addr = id - acmod_set->n_ci;

    *phone         = multi[addr].base;
    *left_context  = multi[addr].left_context;
    *right_context = multi[addr].right_context;
    *posn          = multi[addr].posn;

    assert(acmod_set_tri2id(acmod_set,
			    multi[addr].base,
			    multi[addr].left_context,
			    multi[addr].right_context,
			    multi[addr].posn) == id);
			    
    return S3_SUCCESS;
}